

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O0

void __thiscall tf::Executor::_process_exception(Executor *this,Worker *param_2,Node *node)

{
  uint uVar1;
  uint *puVar2;
  long in_RDX;
  bool bVar3;
  Topology *tpg;
  Node *anchor;
  memory_order __b;
  exception_ptr *in_stack_fffffffffffffe60;
  exception_ptr *in_stack_fffffffffffffe68;
  exception_ptr *in_stack_fffffffffffffe70;
  uint local_164;
  uint local_114;
  uint local_c4;
  long local_80;
  
  local_80 = in_RDX;
  while( true ) {
    bVar3 = false;
    if (local_80 != 0) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      bVar3 = (*(uint *)(local_80 + 4) & 0x40000000) == 0;
    }
    if (!bVar3) break;
    puVar2 = (uint *)(local_80 + 4);
    local_c4 = *puVar2;
    do {
      LOCK();
      uVar1 = *puVar2;
      bVar3 = local_c4 == uVar1;
      if (bVar3) {
        *puVar2 = local_c4 | 0x30000000;
        uVar1 = local_c4;
      }
      UNLOCK();
      local_c4 = uVar1;
    } while (!bVar3);
    local_80 = *(long *)(local_80 + 0x38);
  }
  if (local_80 == 0) {
    if (*(long *)(in_RDX + 0x30) != 0) {
      puVar2 = (uint *)(*(long *)(in_RDX + 0x30) + 0x68);
      local_164 = *puVar2;
      do {
        LOCK();
        uVar1 = *puVar2;
        bVar3 = local_164 == uVar1;
        if (bVar3) {
          *puVar2 = local_164 | 0x30000000;
          uVar1 = local_164;
        }
        UNLOCK();
        local_164 = uVar1;
      } while (!bVar3);
      if ((uVar1 & 0x10000000) == 0) {
        std::current_exception();
        std::__exception_ptr::exception_ptr::operator=
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
        std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_fffffffffffffe60);
        return;
      }
    }
  }
  else {
    puVar2 = (uint *)(local_80 + 4);
    local_114 = *puVar2;
    do {
      LOCK();
      uVar1 = *puVar2;
      bVar3 = local_114 == uVar1;
      if (bVar3) {
        *puVar2 = local_114 | 0x30000000;
        uVar1 = local_114;
      }
      UNLOCK();
      local_114 = uVar1;
    } while (!bVar3);
    if ((uVar1 & 0x10000000) == 0) {
      std::current_exception();
      std::__exception_ptr::exception_ptr::operator=
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_fffffffffffffe60);
      return;
    }
  }
  std::current_exception();
  std::__exception_ptr::exception_ptr::operator=
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::__exception_ptr::exception_ptr::~exception_ptr(in_stack_fffffffffffffe60);
  return;
}

Assistant:

inline void Executor::_process_exception(Worker&, Node* node) {

  constexpr static auto flag = ESTATE::EXCEPTION | ESTATE::CANCELLED;

  // find the anchor and mark the entire path with exception so recursive
  // or nested tasks can be cancelled properly
  // since exception can come from asynchronous task (with runtime), the node
  // itself can be anchored
  auto anchor = node;
  while(anchor && (anchor->_estate.load(std::memory_order_relaxed) & ESTATE::ANCHORED) == 0) {
    anchor->_estate.fetch_or(flag, std::memory_order_relaxed);
    anchor = anchor->_parent;
  }

  // the exception occurs under a blocking call (e.g., corun, join)
  if(anchor) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((anchor->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      anchor->_exception_ptr = std::current_exception();
      return;
    }
  }
  // otherwise, we simply store the exception in the topology and cancel it
  else if(auto tpg = node->_topology; tpg) {
    // multiple tasks may throw, and we only take the first thrown exception
    if((tpg->_estate.fetch_or(flag, std::memory_order_relaxed) & ESTATE::EXCEPTION) == 0) {
      tpg->_exception_ptr = std::current_exception();
      return;
    }
  }
  
  // for now, we simply store the exception in this node; this can happen in an 
  // execution that does not have any external control to capture the exception,
  // such as silent async task
  node->_exception_ptr = std::current_exception();
}